

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  void *local_50;
  int *local_48;
  size_t local_40;
  int local_38;
  Allocator *local_30;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  size_t local_18;
  
  if (this->per_channel_pad_data_size != 0) {
    (*mb->_vptr_ModelBin[2])(&local_50,mb,(ulong)(uint)this->per_channel_pad_data_size,1);
    if (&this->per_channel_pad_data != (Mat *)&local_50) {
      if (local_48 != (int *)0x0) {
        LOCK();
        *local_48 = *local_48 + 1;
        UNLOCK();
      }
      piVar1 = (this->per_channel_pad_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          __ptr = (this->per_channel_pad_data).data;
          pAVar2 = (this->per_channel_pad_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*(long *)pAVar2 + 0x18))();
          }
        }
      }
      (this->per_channel_pad_data).data = local_50;
      (this->per_channel_pad_data).refcount = local_48;
      (this->per_channel_pad_data).elemsize = local_40;
      (this->per_channel_pad_data).elempack = local_38;
      (this->per_channel_pad_data).allocator = local_30;
      (this->per_channel_pad_data).dims = local_28;
      (this->per_channel_pad_data).w = iStack_24;
      (this->per_channel_pad_data).h = iStack_20;
      (this->per_channel_pad_data).c = iStack_1c;
      (this->per_channel_pad_data).cstep = local_18;
    }
    if (local_48 != (int *)0x0) {
      LOCK();
      *local_48 = *local_48 + -1;
      UNLOCK();
      if (*local_48 == 0) {
        if (local_30 == (Allocator *)0x0) {
          if (local_50 != (void *)0x0) {
            free(local_50);
          }
        }
        else {
          (**(code **)(*(long *)local_30 + 0x18))();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}